

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O2

int __thiscall OpenMD::DumpReader::readStuntDoubles(DumpReader *this,istream *inputStream)

{
  char *__s;
  long lVar1;
  long *plVar2;
  int iVar3;
  string line;
  allocator<char> local_51;
  string local_50;
  
  __s = this->buffer;
  std::istream::getline((char *)inputStream,(long)__s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
  iVar3 = 0;
  lVar1 = std::__cxx11::string::find((char *)&local_50,0x23e59b);
  if (lVar1 == -1) {
    builtin_strncpy(painCave.errMsg + 0x20,"Doubles>\n",10);
    builtin_strncpy(painCave.errMsg + 0x10,": Missing <Stunt",0x10);
    builtin_strncpy(painCave.errMsg,"DumpReader Error",0x10);
    painCave.isFatal = 1;
    simError();
  }
  while( true ) {
    plVar2 = (long *)std::istream::getline((char *)inputStream,(long)__s);
    if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) break;
    std::__cxx11::string::assign((char *)&local_50);
    lVar1 = std::__cxx11::string::find((char *)&local_50,0x23e5d4);
    if (lVar1 != -1) break;
    parseDumpLine(this,&local_50);
    iVar3 = iVar3 + 1;
  }
  std::__cxx11::string::~string((string *)&local_50);
  return iVar3;
}

Assistant:

int DumpReader::readStuntDoubles(std::istream& inputStream) {
    inputStream.getline(buffer, bufferSize);
    std::string line(buffer);

    if (line.find("<StuntDoubles>") == std::string::npos) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "DumpReader Error: Missing <StuntDoubles>\n");
      painCave.isFatal = 1;
      simError();
    }

    int nSD = 0;

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</StuntDoubles>") != std::string::npos) { break; }

      parseDumpLine(line);
      nSD++;
    }

    return nSD;
  }